

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsParser.cxx
# Opt level: O2

void __thiscall
kws::Parser::FindPrivateArea(Parser *this,size_t *before,size_t *after,size_t startPos)

{
  ulong uVar1;
  size_t sVar2;
  ulong uVar3;
  allocator local_71;
  string local_70;
  string local_50;
  
  *before = 0;
  *after = 0;
  uVar1 = FindArea(this,"public",startPos);
  sVar2 = FindArea(this,"private",startPos);
  uVar3 = FindArea(this,"protected",startPos);
  if (sVar2 == 0xffffffffffffffff) {
    sVar2 = 99999999;
  }
  if (uVar1 == 0xffffffffffffffff) {
    uVar1 = 99999999;
  }
  if (uVar3 == 0xffffffffffffffff) {
    uVar3 = 99999999;
  }
  if (uVar1 < sVar2 || uVar3 < sVar2) {
    if (sVar2 < uVar1 || uVar3 < sVar2) {
      *before = sVar2;
      if ((uVar1 < sVar2 || sVar2 < uVar3) &&
         (uVar1 = FindEndOfClass(this,sVar2), uVar1 == 0xffffffffffffffff)) {
        uVar1 = sVar2;
      }
    }
    else {
      *before = sVar2;
      uVar1 = uVar3;
    }
  }
  else {
    *before = sVar2;
    if (uVar3 <= uVar1) {
      uVar1 = uVar3;
    }
  }
  *after = uVar1;
  if (uVar1 == 99999999) {
    std::__cxx11::string::string((string *)&local_50,"",&local_71);
    sVar2 = GetClassPosition(this,startPos,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    if ((sVar2 != 0xffffffffffffffff) &&
       (sVar2 = std::__cxx11::string::find((char *)&this->m_BufferNoComment,0x154cbe),
       sVar2 != 0xffffffffffffffff)) {
      std::__cxx11::string::string((string *)&local_70,"",&local_71);
      sVar2 = FindClosingChar(this,'{','}',sVar2,true,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      if (sVar2 != 0xffffffffffffffff) {
        *after = sVar2;
      }
    }
  }
  return;
}

Assistant:

void Parser::FindPrivateArea(size_t &before, size_t &after, size_t startPos) const
{
  before = 0;
  after = 0;

  // First look if public is before protected and private
  size_t pub = this->FindArea("public", startPos);
  size_t priv = this->FindArea("private", startPos);
  size_t protect = this->FindArea("protected", startPos);

  if(priv == std::string::npos)
    {
    priv = MAX_CHAR;
    }

  if(pub == std::string::npos)
    {
    pub = MAX_CHAR;
    }

  if(protect == std::string::npos)
    {
    protect = MAX_CHAR;
    }

  if(priv>pub || priv>protect)
     {
     if(priv>=pub && priv<=protect)
       {
       before = priv;
       after = protect;
       }
     else if(priv<=pub && priv>=protect)
       {
       before = priv;
       after = pub;
       }
     else
       {
       before = priv;
       size_t eoc = this->FindEndOfClass(priv);
       if(eoc != std::string::npos)
         {
         after = eoc;
         }
       else
         {
         after = priv; // end of class
         }
       }
     }
  else
    {
    before = priv;
    if(pub<protect)
      {
      after = pub;
      }
    else
      {
      after = protect;
      }
    }

  // If there is nothing after we point to the end of the class
  if(after == MAX_CHAR)
    {
    size_t classpos = this->GetClassPosition(startPos);
    if(classpos != std::string::npos)
      {
      size_t posBrace = m_BufferNoComment.find("{",classpos);
      if(posBrace != std::string::npos)
        {
        size_t end = this->FindClosingChar('{','}',posBrace,true);
        if(end != std::string::npos)
          {
          after = end;
          }
        }
      }
    }
}